

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.hpp
# Opt level: O2

Color __thiscall PlasticBSDF::f(PlasticBSDF *this,Color *albedo,vec3f *wo,vec3f *wi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  vec3f vVar12;
  Color CVar13;
  vec3f local_28;
  
  fVar3 = DielectricBRDF::reflectivity(ABS(wo->z),*(float *)&(this->super_BSDF).field_0x24);
  fVar4 = 1.0 - wi->z * wi->z;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar5 = 0.0;
  fVar4 = fVar4 / *(float *)&(this->super_BSDF).field_0x24;
  fVar9 = 0.0;
  fVar10 = 0.0;
  if (fVar4 < 1.0) {
    fVar4 = 1.0 - fVar4 * fVar4;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar4 = DielectricBRDF::reflectivity(fVar4,1.0 / *(float *)&(this->super_BSDF).field_0x24);
    fVar4 = (1.0 - fVar3) * (1.0 - fVar4);
    fVar3 = *(float *)&(this->super_BSDF).field_0x24;
    vVar12 = operator*(albedo,1.0 - this->outRatio);
    auVar6._0_4_ = (undefined4)DAT_00147120;
    auVar6._4_4_ = fVar4;
    auVar6._8_4_ = DAT_00147120._4_4_;
    auVar6._12_4_ = 0;
    auVar7._4_4_ = 1.0 - vVar12.z;
    auVar7._0_4_ = fVar3 * fVar3;
    auVar7._8_8_ = 0;
    auVar7 = divps(auVar6,auVar7);
    fVar3 = auVar7._0_4_;
    fVar9 = auVar7._4_4_;
    auVar11._4_4_ = fVar4;
    auVar11._0_4_ = fVar4;
    auVar11._8_8_ = 0;
    auVar2._4_4_ = 1.0 - vVar12.y;
    auVar2._0_4_ = 1.0 - vVar12.x;
    auVar2._8_4_ = 0.0 - extraout_XMM0_Dc;
    auVar2._12_4_ = 0.0 - extraout_XMM0_Dd;
    auVar7 = divps(auVar11,auVar2);
    auVar8._0_4_ = fVar3 * auVar7._0_4_;
    auVar8._4_4_ = fVar3 * auVar7._4_4_;
    auVar8._8_4_ = fVar9 * auVar7._8_4_;
    auVar8._12_4_ = fVar9 * auVar7._12_4_;
    local_28.z = (fVar9 * fVar3) / PI;
    auVar1._4_4_ = PI;
    auVar1._0_4_ = PI;
    auVar1._8_8_ = 0;
    auVar7 = divps(auVar8,auVar1);
    local_28._0_8_ = auVar7._0_8_;
    vVar12 = operator*(&local_28,albedo);
    fVar5 = vVar12.z;
    fVar9 = vVar12.x;
    fVar10 = vVar12.y;
  }
  CVar13.y = fVar10;
  CVar13.x = fVar9;
  CVar13.z = fVar5;
  return CVar13;
}

Assistant:

Color f(const Color& albedo, const vec3f& wo, const vec3f& wi) const
	{
		// non-Dirac component only
		float energy = 1;
		energy *= 1 - DielectricBRDF::reflectivity(fabs(wo.z), IOR);
		float sint = sqrtf(1-wi.z*wi.z)/IOR;
		if (sint >= 1) return 0; // total reflect (shouldn't happen if IOR>1)
		float cost = sqrtf(1-sint*sint);
		energy *= 1 - DielectricBRDF::reflectivity(cost, 1/IOR);
		float ratio2 = 1/(IOR*IOR); // see note_refract_radiance
		return energy / (1 - albedo * (1-outRatio)) * ratio2 * 1/PI * albedo;
	}